

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O0

matrix4d * __thiscall
tinyusdz::value::Mult<tinyusdz::value::matrix4d,double,4ul>
          (matrix4d *__return_storage_ptr__,value *this,matrix4d *m,matrix4d *n)

{
  ulong local_38;
  size_t k;
  double value;
  size_t i;
  size_t j;
  matrix4d *n_local;
  matrix4d *m_local;
  
  matrix4d::matrix4d(__return_storage_ptr__);
  for (i = 0; i < 4; i = i + 1) {
    for (value = 0.0; (ulong)value < 4; value = (double)((long)value + 1)) {
      k = 0;
      for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
        k = (size_t)(*(double *)(this + local_38 * 8 + i * 0x20) * m->m[local_38][(long)value] +
                    (double)k);
      }
      __return_storage_ptr__->m[i][(long)value] = (double)k;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MTy Mult(const MTy &m, const MTy &n) {
  MTy ret;
  //memset(ret.m, 0, sizeof(MTy)); 

  for (size_t j = 0; j < N; j++) {
    for (size_t i = 0; i < N; i++) {
      STy value = static_cast<STy>(0);
      for (size_t k = 0; k < N; k++) {
        value += m.m[j][k] * n.m[k][i];
      }
      ret.m[j][i] = value;
    }
  }

  return ret;
}